

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  XmlFormatting fmt;
  ScopedElement *pSVar1;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [24];
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48 [32];
  TestGroupStats *local_18;
  TestGroupStats *testGroupStats_local;
  XmlReporter *this_local;
  
  local_18 = testGroupStats;
  testGroupStats_local = (TestGroupStats *)this;
  StreamingReporterBase<Catch::XmlReporter>::testGroupEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testGroupStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"OverallResults",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffd8,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"successes",&local_81);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)&stack0xffffffffffffffd8,&local_80,
                      &(local_18->totals).assertions.passed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"failures",&local_a9);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     (pSVar1,&local_a8,&(local_18->totals).assertions.failed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"expectedFailures",(allocator<char> *)(local_e8 + 0x17));
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (pSVar1,&local_d0,&(local_18->totals).assertions.failedButOk);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x17));
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"OverallResultsCases",&local_109);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_e8,(string *)&this->m_xml,(XmlFormatting)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"successes",&local_131);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)local_e8,&local_130,&(local_18->totals).testCases.passed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"failures",&local_159);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     (pSVar1,&local_158,&(local_18->totals).testCases.failed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"expectedFailures",&local_181);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (pSVar1,&local_180,&(local_18->totals).testCases.failedButOk);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  fmt = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  return;
}

Assistant:

void XmlReporter::testGroupEnded( TestGroupStats const& testGroupStats ) {
        StreamingReporterBase::testGroupEnded( testGroupStats );
        // TODO: Check testGroupStats.aborting and act accordingly.
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
            .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testGroupStats.totals.testCases.passed )
            .writeAttribute( "failures", testGroupStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }